

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-stroker.c
# Opt level: O3

PVG_FT_Error ft_stroker_arcto(PVG_FT_Stroker stroker,PVG_FT_Int side)

{
  PVG_FT_Angle PVar1;
  long lVar2;
  PVG_FT_Fixed PVar3;
  PVG_FT_Long PVar4;
  PVG_FT_Long PVar5;
  long lVar6;
  ulong uVar7;
  long b;
  long lVar8;
  PVG_FT_Vector local_b8;
  PVG_FT_StrokeBorder local_a0;
  PVG_FT_Fixed local_98;
  ulong local_90;
  long local_88;
  PVG_FT_Stroker local_80;
  PVG_FT_Vector local_78;
  long local_68;
  long lStack_60;
  PVG_FT_Vector local_58;
  PVG_FT_Vector local_48;
  
  local_98 = stroker->radius;
  uVar7 = (ulong)(uint)side;
  PVar1 = PVG_FT_Angle_Diff(stroker->angle_in,stroker->angle_out);
  lVar8 = uVar7 * 0x1680000 + -0xb40000;
  if (PVar1 != 0xb40000) {
    lVar8 = PVar1;
  }
  local_a0 = stroker->borders + uVar7;
  lVar2 = -lVar8;
  if (0 < lVar8) {
    lVar2 = lVar8;
  }
  if (lVar2 < 0x5a0001) {
    lVar2 = 0x5a0000;
  }
  lVar6 = uVar7 * -0xb40000 + stroker->angle_in + 0x5a0000;
  uVar7 = (lVar2 - 1U) / 0x5a0000 + 1;
  PVar3 = PVG_FT_Tan(lVar8 / (long)(ulong)(uint)((int)uVar7 * 4));
  b = PVar3 / 3 + PVar3;
  local_88 = lVar6;
  PVG_FT_Vector_From_Polar(&local_48,local_98,lVar6);
  PVar4 = PVG_FT_MulFix(-local_48.y,b);
  PVar5 = PVG_FT_MulFix(local_48.x,b);
  local_48.x = (stroker->center).x + local_48.x;
  local_48.y = (stroker->center).y + local_48.y;
  local_78.x = PVar4 + local_48.x;
  local_78.y = PVar5 + local_48.y;
  lVar6 = (uVar7 & 0xffffffff) + (ulong)((uVar7 & 0xffffffff) == 0);
  lVar2 = lVar8;
  local_90 = uVar7;
  local_80 = stroker;
  do {
    PVG_FT_Vector_From_Polar(&local_b8,local_98,lVar2 / (long)local_90 + local_88);
    PVar4 = PVG_FT_MulFix(local_b8.y,b);
    PVar5 = PVG_FT_MulFix(-local_b8.x,b);
    local_b8.x = (local_80->center).x + local_b8.x;
    local_b8.y = (local_80->center).y + local_b8.y;
    local_68 = PVar4 + local_b8.x;
    lStack_60 = PVar5 + local_b8.y;
    local_58.x = local_68;
    local_58.y = lStack_60;
    ft_stroke_border_cubicto(local_a0,&local_78,&local_58,&local_b8);
    local_78.x = local_b8.x * 2 - local_68;
    local_78.y = local_b8.y * 2 - lStack_60;
    lVar2 = lVar2 + lVar8;
    lVar6 = lVar6 + -1;
  } while (lVar6 != 0);
  local_a0->movable = '\0';
  return (PVG_FT_Error)local_a0;
}

Assistant:

static PVG_FT_Error ft_stroker_arcto(PVG_FT_Stroker stroker, PVG_FT_Int side)
{
    PVG_FT_Angle        total, rotate;
    PVG_FT_Fixed        radius = stroker->radius;
    PVG_FT_Error        error = 0;
    PVG_FT_StrokeBorder border = stroker->borders + side;

    rotate = PVG_FT_SIDE_TO_ROTATE(side);

    total = PVG_FT_Angle_Diff(stroker->angle_in, stroker->angle_out);
    if (total == PVG_FT_ANGLE_PI) total = -rotate * 2;

    error = ft_stroke_border_arcto(border, &stroker->center, radius,
                                   stroker->angle_in + rotate, total);
    border->movable = FALSE;
    return error;
}